

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavProcessItem(void)

{
  uint uVar1;
  ImGuiNavLayer IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  ImGuiNavItemData *local_70;
  bool local_65;
  ImVec2 local_64;
  ImVec2 local_5c;
  float VISIBLE_RATIO;
  ImGuiNavItemData *result;
  bool is_tabbing;
  bool is_tab_stop;
  ImVec2 local_3c;
  undefined1 auStack_2c [3];
  bool candidate_for_nav_default_focus;
  ImGuiItemFlags item_flags;
  ImRect nav_bb;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  unique0x00012000 = GImGui->CurrentWindow;
  nav_bb.Max.x = (float)(GImGui->LastItemData).ID;
  _auStack_2c = (GImGui->LastItemData).NavRect.Min;
  nav_bb.Min = (GImGui->LastItemData).NavRect.Max;
  uVar1 = (GImGui->LastItemData).InFlags;
  if (((GImGui->NavInitRequest & 1U) != 0) &&
     (GImGui->NavLayer == (unique0x00012000->DC).NavLayerCurrent)) {
    bVar4 = (uVar1 & 0x14) == 0;
    if ((bVar4) || (GImGui->NavInitResultId == 0)) {
      GImGui->NavInitResultId = (ImGuiID)nav_bb.Max.x;
      IVar7 = WindowRectAbsToRel(unique0x00012000,(ImRect *)auStack_2c);
      stack0xffffffffffffffbc = IVar7.Min;
      (pIVar3->NavInitResultRectRel).Min = stack0xffffffffffffffbc;
      local_3c = IVar7.Max;
      (pIVar3->NavInitResultRectRel).Max = local_3c;
    }
    if (bVar4) {
      pIVar3->NavInitRequest = false;
      NavUpdateAnyRequestFlag();
    }
  }
  if ((pIVar3->NavMoveScoringItems & 1U) != 0) {
    local_65 = (uVar1 & 0x100) != 0 && (uVar1 & 5) == 0;
    bVar4 = (pIVar3->NavMoveFlags & 0x400U) == 0;
    if (bVar4) {
      if ((((float)pIVar3->NavId != nav_bb.Max.x) || ((pIVar3->NavMoveFlags & 0x10U) != 0)) &&
         ((uVar1 & 0xc) == 0)) {
        if (stack0xffffffffffffffe8 == pIVar3->NavWindow) {
          local_70 = &pIVar3->NavMoveResultLocal;
        }
        else {
          local_70 = &pIVar3->NavMoveResultOther;
        }
        if (bVar4) {
          bVar4 = NavScoreItem(local_70);
          if (bVar4) {
            NavApplyItemToResult(local_70);
          }
          if (((pIVar3->NavMoveFlags & 0x20U) != 0) &&
             (bVar4 = ImRect::Overlaps(&stack0xffffffffffffffe8->ClipRect,(ImRect *)auStack_2c),
             bVar4)) {
            fVar5 = ImClamp<float>(nav_bb.Min.y,(stack0xffffffffffffffe8->ClipRect).Min.y,
                                   (stack0xffffffffffffffe8->ClipRect).Max.y);
            fVar6 = ImClamp<float>((float)item_flags,(stack0xffffffffffffffe8->ClipRect).Min.y,
                                   (stack0xffffffffffffffe8->ClipRect).Max.y);
            if (((nav_bb.Min.y - (float)item_flags) * 0.7 <= fVar5 - fVar6) &&
               (bVar4 = NavScoreItem(&pIVar3->NavMoveResultLocalVisible), bVar4)) {
              NavApplyItemToResult(&pIVar3->NavMoveResultLocalVisible);
            }
          }
        }
      }
    }
    else if ((local_65) || ((pIVar3->NavMoveFlags & 0x200U) != 0)) {
      NavProcessItemForTabbingRequest((ImGuiID)nav_bb.Max.x);
    }
  }
  if ((float)pIVar3->NavId == nav_bb.Max.x) {
    pIVar3->NavWindow = stack0xffffffffffffffe8;
    pIVar3->NavLayer = (stack0xffffffffffffffe8->DC).NavLayerCurrent;
    pIVar3->NavFocusScopeId = (stack0xffffffffffffffe8->DC).NavFocusScopeIdCurrent;
    pIVar3->NavIdIsAlive = true;
    IVar7 = WindowRectAbsToRel(stack0xffffffffffffffe8,(ImRect *)auStack_2c);
    IVar2 = (stack0xffffffffffffffe8->DC).NavLayerCurrent;
    local_64 = IVar7.Min;
    stack0xffffffffffffffe8->NavRectRel[IVar2].Min = local_64;
    local_5c = IVar7.Max;
    (&stack0xffffffffffffffe8->NavRectRel[IVar2].Min)[1] = local_5c;
  }
  return;
}

Assistant:

static void ImGui::NavProcessItem()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = g.LastItemData.ID;
    const ImRect nav_bb = g.LastItemData.NavRect;
    const ImGuiItemFlags item_flags = g.LastItemData.InFlags;

    // Process Init Request
    if (g.NavInitRequest && g.NavLayer == window->DC.NavLayerCurrent)
    {
        // Even if 'ImGuiItemFlags_NoNavDefaultFocus' is on (typically collapse/close button) we record the first ResultId so they can be used as a fallback
        const bool candidate_for_nav_default_focus = (item_flags & (ImGuiItemFlags_NoNavDefaultFocus | ImGuiItemFlags_Disabled)) == 0;
        if (candidate_for_nav_default_focus || g.NavInitResultId == 0)
        {
            g.NavInitResultId = id;
            g.NavInitResultRectRel = WindowRectAbsToRel(window, nav_bb);
        }
        if (candidate_for_nav_default_focus)
        {
            g.NavInitRequest = false; // Found a match, clear request
            NavUpdateAnyRequestFlag();
        }
    }

    // Process Move Request (scoring for navigation)
    // FIXME-NAV: Consider policy for double scoring (scoring from NavScoringRect + scoring from a rect wrapped according to current wrapping policy)
    if (g.NavMoveScoringItems)
    {
        const bool is_tab_stop = (item_flags & ImGuiItemFlags_Inputable) && (item_flags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
        const bool is_tabbing = (g.NavMoveFlags & ImGuiNavMoveFlags_Tabbing) != 0;
        if (is_tabbing)
        {
            if (is_tab_stop || (g.NavMoveFlags & ImGuiNavMoveFlags_FocusApi))
                NavProcessItemForTabbingRequest(id);
        }
        else if ((g.NavId != id || (g.NavMoveFlags & ImGuiNavMoveFlags_AllowCurrentNavId)) && !(item_flags & (ImGuiItemFlags_Disabled | ImGuiItemFlags_NoNav)))
        {
            ImGuiNavItemData* result = (window == g.NavWindow) ? &g.NavMoveResultLocal : &g.NavMoveResultOther;
            if (!is_tabbing)
            {
                if (NavScoreItem(result))
                    NavApplyItemToResult(result);

                // Features like PageUp/PageDown need to maintain a separate score for the visible set of items.
                const float VISIBLE_RATIO = 0.70f;
                if ((g.NavMoveFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet) && window->ClipRect.Overlaps(nav_bb))
                    if (ImClamp(nav_bb.Max.y, window->ClipRect.Min.y, window->ClipRect.Max.y) - ImClamp(nav_bb.Min.y, window->ClipRect.Min.y, window->ClipRect.Max.y) >= (nav_bb.Max.y - nav_bb.Min.y) * VISIBLE_RATIO)
                        if (NavScoreItem(&g.NavMoveResultLocalVisible))
                            NavApplyItemToResult(&g.NavMoveResultLocalVisible);
            }
        }
    }

    // Update window-relative bounding box of navigated item
    if (g.NavId == id)
    {
        g.NavWindow = window;                                           // Always refresh g.NavWindow, because some operations such as FocusItem() don't have a window.
        g.NavLayer = window->DC.NavLayerCurrent;
        g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
        g.NavIdIsAlive = true;
        window->NavRectRel[window->DC.NavLayerCurrent] = WindowRectAbsToRel(window, nav_bb);    // Store item bounding box (relative to window position)
    }
}